

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::TraverseSchema::traverseIdentityConstraint
          (TraverseSchema *this,IdentityConstraint *ic,DOMElement *icElem)

{
  XSAnnotation *pXVar1;
  bool bVar2;
  int iVar3;
  DOMElement *pDVar4;
  DOMNode *pDVar5;
  undefined4 extraout_var;
  XSAnnotation *pXVar6;
  XMLCh *pXVar7;
  XMLSize_t XVar8;
  XercesXPath *pXVar9;
  IC_Selector *this_00;
  undefined4 extraout_var_00;
  IC_Field *this_01;
  XSAnnotation *local_50;
  NamespaceScopeManager nsMgr;
  
  NamespaceScopeManager::NamespaceScopeManager(&nsMgr,icElem,this->fSchemaInfo,this);
  pDVar4 = XUtil::getFirstChildElement(&icElem->super_DOMNode);
  pDVar5 = &checkContent(this,icElem,pDVar4,false,true)->super_DOMNode;
  local_50 = this->fAnnotation;
  if ((local_50 == (XSAnnotation *)0x0 & this->fScanner->fGenerateSyntheticAnnotations) == 1) {
    if (this->fNonXSAttList->fCurCount == 0) {
      local_50 = (XSAnnotation *)0x0;
    }
    else {
      local_50 = generateSyntheticAnnotation(this,icElem,this->fNonXSAttList);
      this->fAnnotation = local_50;
    }
  }
  if (pDVar5 == (DOMNode *)0x0) {
LAB_0031d929:
    if (local_50 != (XSAnnotation *)0x0) {
      (*(local_50->super_XSerializable)._vptr_XSerializable[1])();
    }
  }
  else {
    iVar3 = (*pDVar5->_vptr_DOMNode[0x18])(pDVar5);
    bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var,iVar3),
                              (XMLCh *)SchemaSymbols::fgELT_SELECTOR);
    if (!bVar2) {
      reportSchemaError(this,(DOMElement *)pDVar5,(XMLCh *)XMLUni::fgXMLErrDomain,0x83);
      goto LAB_0031d929;
    }
    GeneralAttributeCheck::checkAttributes
              (&this->fAttributeCheck,(DOMElement *)pDVar5,0x29,this,false,this->fNonXSAttList);
    pDVar4 = XUtil::getFirstChildElement(pDVar5);
    pDVar4 = checkContent(this,icElem,pDVar4,true,true);
    if (pDVar4 != (DOMElement *)0x0) {
      reportSchemaError(this,(DOMElement *)pDVar5,(XMLCh *)XMLUni::fgXMLErrDomain,0x4d);
    }
    pXVar6 = this->fAnnotation;
    pXVar1 = local_50;
    if ((pXVar6 == (XSAnnotation *)0x0 & this->fScanner->fGenerateSyntheticAnnotations) == 1) {
      if (this->fNonXSAttList->fCurCount != 0) {
        pXVar6 = generateSyntheticAnnotation(this,(DOMElement *)pDVar5,this->fNonXSAttList);
        this->fAnnotation = pXVar6;
        goto LAB_0031d604;
      }
    }
    else {
LAB_0031d604:
      if ((pXVar6 != (XSAnnotation *)0x0) && (pXVar1 = pXVar6, local_50 != (XSAnnotation *)0x0)) {
        XSAnnotation::setNext(local_50,pXVar6);
        pXVar1 = local_50;
      }
    }
    local_50 = pXVar1;
    pXVar7 = getElementAttValue(this,(DOMElement *)pDVar5,(XMLCh *)SchemaSymbols::fgATT_XPATH,
                                UnKnown);
    XVar8 = XMLString::stringLen(pXVar7);
    if ((pXVar7 == (XMLCh *)0x0) || (XVar8 == 0)) {
      reportSchemaError(this,(DOMElement *)pDVar5,(XMLCh *)XMLUni::fgXMLErrDomain,0x86);
      goto LAB_0031d929;
    }
    pXVar9 = (XercesXPath *)XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
    XercesXPath::XercesXPath
              (pXVar9,pXVar7,this->fStringPool,
               &this->fSchemaInfo->fNamespaceScope->super_XercesNamespaceResolver,
               this->fEmptyNamespaceURI,true,this->fGrammarPoolMemoryManager);
    this_00 = (IC_Selector *)XMemory::operator_new(0x18,this->fGrammarPoolMemoryManager);
    IC_Selector::IC_Selector(this_00,pXVar9,ic);
    IdentityConstraint::setSelector(ic,this_00);
    pDVar5 = &XUtil::getNextSiblingElement(pDVar5)->super_DOMNode;
    if (pDVar5 == (DOMNode *)0x0) {
      reportSchemaError(this,icElem,(XMLCh *)XMLUni::fgXMLErrDomain,0x83);
      goto LAB_0031d929;
    }
    for (; pDVar5 != (DOMNode *)0x0; pDVar5 = &XUtil::getNextSiblingElement(pDVar5)->super_DOMNode)
    {
      iVar3 = (*pDVar5->_vptr_DOMNode[0x18])(pDVar5);
      bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_00,iVar3),
                                (XMLCh *)SchemaSymbols::fgELT_FIELD);
      if (bVar2) {
        GeneralAttributeCheck::checkAttributes
                  (&this->fAttributeCheck,(DOMElement *)pDVar5,0x14,this,false,this->fNonXSAttList);
        pDVar4 = XUtil::getFirstChildElement(pDVar5);
        pDVar4 = checkContent(this,icElem,pDVar4,true,true);
        if (pDVar4 != (DOMElement *)0x0) {
          reportSchemaError(this,(DOMElement *)pDVar5,(XMLCh *)XMLUni::fgXMLErrDomain,0x4d);
        }
        pXVar6 = this->fAnnotation;
        pXVar1 = local_50;
        if ((pXVar6 == (XSAnnotation *)0x0 & this->fScanner->fGenerateSyntheticAnnotations) == 1) {
          if (this->fNonXSAttList->fCurCount != 0) {
            pXVar6 = generateSyntheticAnnotation(this,(DOMElement *)pDVar5,this->fNonXSAttList);
            this->fAnnotation = pXVar6;
            goto LAB_0031d7bc;
          }
        }
        else {
LAB_0031d7bc:
          if ((pXVar6 != (XSAnnotation *)0x0) && (pXVar1 = pXVar6, local_50 != (XSAnnotation *)0x0))
          {
            XSAnnotation::setNext(local_50,pXVar6);
            pXVar1 = local_50;
          }
        }
        local_50 = pXVar1;
        pXVar7 = getElementAttValue(this,(DOMElement *)pDVar5,(XMLCh *)SchemaSymbols::fgATT_XPATH,
                                    UnKnown);
        if ((pXVar7 == (XMLCh *)0x0) || (*pXVar7 == L'\0')) {
          reportSchemaError(this,(DOMElement *)pDVar5,(XMLCh *)XMLUni::fgXMLErrDomain,0x86);
          goto LAB_0031d929;
        }
        pXVar9 = (XercesXPath *)XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
        XercesXPath::XercesXPath
                  (pXVar9,pXVar7,this->fStringPool,
                   &this->fSchemaInfo->fNamespaceScope->super_XercesNamespaceResolver,
                   this->fEmptyNamespaceURI,false,this->fGrammarPoolMemoryManager);
        this_01 = (IC_Field *)XMemory::operator_new(0x18,this->fGrammarPoolMemoryManager);
        IC_Field::IC_Field(this_01,pXVar9,ic);
        IdentityConstraint::addField(ic,this_01);
      }
      else {
        reportSchemaError(this,(DOMElement *)pDVar5,(XMLCh *)XMLUni::fgXMLErrDomain,0x83);
      }
    }
    if (local_50 != (XSAnnotation *)0x0) {
      SchemaGrammar::putAnnotation(this->fSchemaGrammar,ic,local_50);
    }
    if ((ic->fFields != (RefVectorOf<xercesc_4_0::IC_Field> *)0x0) &&
       (bVar2 = true, (ic->fFields->super_BaseRefVectorOf<xercesc_4_0::IC_Field>).fCurCount != 0))
    goto LAB_0031d93b;
  }
  bVar2 = false;
LAB_0031d93b:
  NamespaceScopeManager::~NamespaceScopeManager(&nsMgr);
  return bVar2;
}

Assistant:

bool TraverseSchema::traverseIdentityConstraint(IdentityConstraint* const ic,
                                                const DOMElement* const icElem) {

    NamespaceScopeManager nsMgr(icElem, fSchemaInfo, this);

    // ------------------------------------------------------------------
    // First, handle any ANNOTATION declaration
    // ------------------------------------------------------------------
    DOMElement* elem = checkContent(icElem, XUtil::getFirstChildElement(icElem), false);
    if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(icElem, fNonXSAttList);
    }
    Janitor<XSAnnotation> janAnnot(fAnnotation);

    // ------------------------------------------------------------------
    // Get selector
    // ------------------------------------------------------------------
    if (elem == 0) {

//        reportSchemaError(icElem, XMLUni::fgXMLErrDomain, XMLErrs::IC_BadContent);
        return false;
    }

    if (!XMLString::equals(elem->getLocalName(), SchemaSymbols::fgELT_SELECTOR)) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::IC_BadContent);
        return false;
    }

    fAttributeCheck.checkAttributes(
        elem, GeneralAttributeCheck::E_Selector, this, false, fNonXSAttList
    );
    if (checkContent(icElem, XUtil::getFirstChildElement(elem), true) != 0)
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::OnlyAnnotationExpected);
    if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
    }
    if (fAnnotation)
    {
        if (janAnnot.isDataNull())
            janAnnot.reset(fAnnotation);
        else
            janAnnot.get()->setNext(fAnnotation);
    }

    // ------------------------------------------------------------------
    // Get xpath attribute
    // ------------------------------------------------------------------
    const XMLCh* xpathExpr = getElementAttValue(elem, SchemaSymbols::fgATT_XPATH);
    XMLSize_t    xpathLen = XMLString::stringLen(xpathExpr);

    if (!xpathExpr || !xpathLen) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::IC_XPathExprMissing);
        return false;
    }

    // ------------------------------------------------------------------
    // Parse xpath expression
    // ------------------------------------------------------------------
    try {

        XercesXPath* sXPath = new (fGrammarPoolMemoryManager) XercesXPath(xpathExpr, fStringPool, fSchemaInfo->getNamespaceScope(), fEmptyNamespaceURI, true, fGrammarPoolMemoryManager);
        IC_Selector* icSelector = new (fGrammarPoolMemoryManager) IC_Selector(sXPath, ic);
        ic->setSelector(icSelector);
    }
    catch (const XPathException& e) {

        reportSchemaError(elem, e);
        return false;
    }

    // ------------------------------------------------------------------
    // Get fields
    // ------------------------------------------------------------------
    elem = XUtil::getNextSiblingElement(elem);

    if (elem == 0) {

        reportSchemaError(icElem, XMLUni::fgXMLErrDomain, XMLErrs::IC_BadContent);
        return false;
    }

    while (elem != 0) {

        if (!XMLString::equals(elem->getLocalName(), SchemaSymbols::fgELT_FIELD)) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::IC_BadContent);
        }
        else {
            // General Attribute Checking
            fAttributeCheck.checkAttributes(
                elem, GeneralAttributeCheck::E_Field, this, false, fNonXSAttList
            );
            if (checkContent(icElem, XUtil::getFirstChildElement(elem), true) != 0)
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::OnlyAnnotationExpected);
            if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
            {
                fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
            }
            if (fAnnotation)
            {
                if (janAnnot.isDataNull())
                    janAnnot.reset(fAnnotation);
                else
                    janAnnot.get()->setNext(fAnnotation);
            }

            // xpath expression parsing
            xpathExpr = getElementAttValue(elem, SchemaSymbols::fgATT_XPATH);

            if (!xpathExpr || !*xpathExpr) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::IC_XPathExprMissing);
                return false;
            }

            try {

                XercesXPath* fieldXPath = new (fGrammarPoolMemoryManager) XercesXPath
                (
                    xpathExpr
                    , fStringPool
                    , fSchemaInfo->getNamespaceScope()
                    , fEmptyNamespaceURI
                    , false
                    , fGrammarPoolMemoryManager
                );
                IC_Field* icField = new (fGrammarPoolMemoryManager) IC_Field(fieldXPath, ic);
                ic->addField(icField);
            }
            catch (const XPathException& e) {

                reportSchemaError(elem, e);
                return false;
            }
        }

        elem = XUtil::getNextSiblingElement(elem);
    }

    if (!janAnnot.isDataNull())
        fSchemaGrammar->putAnnotation(ic, janAnnot.release());

    if (ic->getFieldCount() == 0) {
        return false;
    }

    return true;
}